

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on<bool>
          (reporter<boost::ext::ut::v1_1_8::printer> *this,assertion_fail<bool> assertion)

{
  printer *ppVar1;
  char *__str;
  colors *pcVar2;
  char local_42 [2];
  int local_40;
  char local_39;
  string_view local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  anon_class_1_0_00000001 local_11;
  reporter<boost::ext::ut::v1_1_8::printer> *prStack_10;
  anon_class_1_0_00000001 short_name;
  reporter<boost::ext::ut::v1_1_8::printer> *this_local;
  
  local_11 = (anon_class_1_0_00000001)0x0;
  prStack_10 = this;
  ppVar1 = printer::operator<<(&this->printer_,(char (*) [4])"\n  ");
  __str = reflection::source_location::file_name(&assertion.location);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,__str);
  local_28 = on<bool>::anon_class_1_0_00000001::operator()(&local_11,local_38);
  ppVar1 = printer::operator<<(ppVar1,&local_28);
  local_39 = ':';
  ppVar1 = printer::operator<<(ppVar1,&local_39);
  local_40 = reflection::source_location::line(&assertion.location);
  ppVar1 = printer::operator<<(ppVar1,&local_40);
  local_42[1] = 0x3a;
  ppVar1 = printer::operator<<(ppVar1,local_42 + 1);
  pcVar2 = printer::colors(&this->printer_);
  ppVar1 = printer::operator<<(ppVar1,&pcVar2->fail);
  ppVar1 = printer::operator<<(ppVar1,(char (*) [7])"FAILED");
  pcVar2 = printer::colors(&this->printer_);
  ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
  ppVar1 = printer::operator<<(ppVar1,(char (*) [3])0xc8e61a);
  ppVar1 = printer::operator<<(ppVar1,std::boolalpha);
  ppVar1 = printer::operator<<(ppVar1,&assertion.expr);
  pcVar2 = printer::colors(&this->printer_);
  ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
  local_42[0] = ']';
  printer::operator<<(ppVar1,local_42);
  (this->asserts_).fail = (this->asserts_).fail + 1;
  return;
}

Assistant:

auto on(events::assertion_fail<TExpr> assertion) -> void {
      constexpr auto short_name = [](std::string_view name) {
        return name.rfind('/') != std::string_view::npos
                   ? name.substr(name.rfind('/') + 1)
                   : name;
      };
      printer_ << "\n  " << short_name(assertion.location.file_name()) << ':'
               << assertion.location.line() << ':' << printer_.colors().fail
               << "FAILED" << printer_.colors().none << " [" << std::boolalpha
               << assertion.expr << printer_.colors().none << ']';
      ++asserts_.fail;
    }